

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
tfnw::TransferFunctionWidget::get_colormapf
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          TransferFunctionWidget *this)

{
  pointer puVar1;
  pointer pfVar2;
  uint in_EAX;
  long lVar3;
  long lVar4;
  undefined8 uStack_18;
  
  this->colormap_changed = false;
  uStack_18 = (ulong)in_EAX;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,
             (long)(this->current_colormap).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->current_colormap).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(value_type_conflict2 *)((long)&uStack_18 + 4),
             (allocator_type *)((long)&uStack_18 + 3));
  puVar1 = (this->current_colormap).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->current_colormap).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pfVar2[lVar4] = (float)puVar1[lVar4] / 255.0;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> TransferFunctionWidget::get_colormapf()
{
    colormap_changed = false;
    std::vector<float> colormapf(current_colormap.size(), 0.f);
    for (size_t i = 0; i < current_colormap.size(); ++i) {
        colormapf[i] = current_colormap[i] / 255.f;
    }
    return colormapf;
}